

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O2

void __thiscall
Qentem::StringUtils::EscapeHTMLSpecialChars<Qentem::StringStream<char>,char>
          (StringUtils *this,StringStream<char> *stream,char *str,SizeT length)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  size_t __n;
  uint uVar4;
  char *left;
  int iVar5;
  uint uVar6;
  uint uVar7;
  void *pvStack_40;
  
  __n = CONCAT44(in_register_0000000c,length);
  uVar4 = (uint)str;
  uVar7 = 0;
  uVar6 = 0;
LAB_0010afd7:
  do {
    while( true ) {
      uVar3 = uVar4 - uVar6;
      iVar5 = (int)stream;
      if (uVar4 <= uVar6) {
        StringStream<char>::write
                  ((StringStream<char> *)this,iVar5 + uVar7,(void *)(ulong)(uVar4 - uVar7),__n);
        return;
      }
      bVar1 = *(byte *)((long)&stream->storage_ + (ulong)uVar6);
      __n = (size_t)bVar1;
      if (bVar1 != 0x22) break;
      StringStream<char>::write
                ((StringStream<char> *)this,uVar7 + iVar5,(void *)(ulong)(uVar6 - uVar7),__n);
      iVar5 = 0x11cf45;
LAB_0010b0e7:
      pvStack_40 = (void *)0x6;
LAB_0010b0e9:
      StringStream<char>::write((StringStream<char> *)this,iVar5,pvStack_40,__n);
      uVar7 = uVar6 + 1;
      uVar6 = uVar7;
    }
    if (bVar1 == 0x3e) {
      StringStream<char>::write
                ((StringStream<char> *)this,uVar7 + iVar5,(void *)(ulong)(uVar6 - uVar7),__n);
      iVar5 = 0x11ceb9;
LAB_0010b09f:
      pvStack_40 = (void *)0x4;
      goto LAB_0010b0e9;
    }
    if (bVar1 == 0x27) {
      StringStream<char>::write
                ((StringStream<char> *)this,uVar7 + iVar5,(void *)(ulong)(uVar6 - uVar7),__n);
      iVar5 = 0x11d3a7;
      goto LAB_0010b0e7;
    }
    if (bVar1 == 0x3c) {
      StringStream<char>::write
                ((StringStream<char> *)this,uVar7 + iVar5,(void *)(ulong)(uVar6 - uVar7),__n);
      iVar5 = 0x11cfab;
      goto LAB_0010b09f;
    }
    if (bVar1 == 0x26) {
      left = (char *)((long)&stream->storage_ + (ulong)uVar6);
      if (uVar3 < 6) {
        if (uVar3 == 5) goto LAB_0010b0ff;
        if (3 < uVar3) goto LAB_0010b129;
      }
      else {
        if (left[5] == ';') {
          bVar2 = IsEqual<char>(left,"&quot;",5);
          if (!bVar2) {
            bVar2 = IsEqual<char>(left,"&apos;",5);
            if (!bVar2) goto LAB_0010b0ff;
          }
          uVar6 = uVar6 + 6;
          goto LAB_0010afd7;
        }
LAB_0010b0ff:
        if (left[4] == ';') {
          bVar2 = IsEqual<char>(left,"&amp;",4);
          if (bVar2) {
            uVar6 = uVar6 + 5;
            goto LAB_0010afd7;
          }
        }
LAB_0010b129:
        if (left[3] == ';') {
          bVar2 = IsEqual<char>(left,"&lt;",3);
          if (!bVar2) {
            bVar2 = IsEqual<char>(left,"&gt;",3);
            if (!bVar2) goto LAB_0010b164;
          }
          uVar6 = uVar6 + 4;
          goto LAB_0010afd7;
        }
      }
LAB_0010b164:
      StringStream<char>::write
                ((StringStream<char> *)this,uVar7 + iVar5,(void *)(ulong)(uVar6 - uVar7),__n);
      iVar5 = 0x11cfeb;
      pvStack_40 = (void *)0x5;
      goto LAB_0010b0e9;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static void EscapeHTMLSpecialChars(StringStream_T &stream, const Char_T *str, SizeT length) {
    using HTMLSpecialChars = HTMLSpecialChars_T<Char_T, sizeof(Char_T)>;

    if (Config::AutoEscapeHTML) {
        SizeT offset = 0;
        SizeT index  = 0;

        while (index < length) {
            switch (str[index]) {
                case '&': {
                    const SizeT   rem_length = (length - index);
                    const Char_T *n_str      = (str + index);

                    if ((rem_length > SizeT{5}) && (n_str[SizeT{5}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLQuote, SizeT{5}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLSingleQuote, SizeT{5})) {
                            index += SizeT{6};
                            break;
                        }
                    }

                    if ((rem_length > SizeT{4}) && (n_str[SizeT{4}] == HTMLSpecialChars::SemicolonChar) &&
                        StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLAnd, SizeT{4})) {
                        index += SizeT{5};
                        break;
                    }

                    if ((rem_length > SizeT{3}) && (n_str[SizeT{3}] == HTMLSpecialChars::SemicolonChar)) {
                        if (StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLLess, SizeT{3}) ||
                            StringUtils::IsEqual(n_str, HTMLSpecialChars::HTMLGreater, SizeT{3})) {
                            index += SizeT{4};
                            break;
                        }
                    }

                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLAnd, HTMLSpecialChars::HTMLAndLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '<': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLLess, HTMLSpecialChars::HTMLLessLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '>': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLGreater, HTMLSpecialChars::HTMLGreaterLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '"': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLQuote, HTMLSpecialChars::HTMLQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                case '\'': {
                    stream.Write((str + offset), (index - offset));
                    stream.Write(HTMLSpecialChars::HTMLSingleQuote, HTMLSpecialChars::HTMLSingleQuoteLength);
                    ++index;
                    offset = index;
                    break;
                }

                default: {
                    ++index;
                }
            }
        }

        stream.Write((str + offset), (length - offset));
    } else {
        stream.Write(str, length);
    }
}